

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O3

int lj_trace_exit(jit_State *J,void *exptr)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  lua_State *L;
  uint64_t uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  ptrdiff_t argbase;
  TValue *pTVar9;
  long lVar10;
  int iVar11;
  uint *puVar12;
  uint uVar13;
  TValue TVar14;
  ulong uVar15;
  ExitDataCP exd;
  jit_State *local_48;
  void *local_40;
  BCIns *local_38;
  
  piVar8 = __errno_location();
  iVar11 = *piVar8;
  L = J->L;
  iVar7 = J->exitcode;
  if (iVar7 == 0) {
    TVar14.u64 = 0xffffffffffffffff;
  }
  else {
    J->exitcode = 0;
    TVar14 = L->top[-1];
  }
  local_48 = J;
  local_40 = exptr;
  iVar6 = lj_vm_cpcall(L,0,&local_48,trace_exit_cp);
  if (iVar6 != 0) {
    return -iVar6;
  }
  if (iVar7 != 0) {
    pTVar9 = L->top;
    L->top = pTVar9 + 1;
    *pTVar9 = TVar14;
  }
  uVar4 = (L->glref).ptr64;
  if (((-1 < *(char *)(uVar4 + 0x91)) && ((*(byte *)(uVar4 + 0x93) & 8) != 0)) &&
     (argbase = lj_vmevent_prepare(L,LJ_VMEVENT_TEXIT), argbase != 0)) {
    pTVar9 = L->top;
    if ((long)((L->maxstack).ptr64 - (long)pTVar9) < 0x1c1) {
      lj_state_growstack(L,0x38);
      pTVar9 = L->top;
    }
    L->top = pTVar9 + 1;
    pTVar9->n = (double)(int)J->parent;
    pTVar9 = L->top;
    L->top = pTVar9 + 1;
    pTVar9->n = (double)(int)J->exitno;
    pTVar9 = L->top;
    L->top = pTVar9 + 1;
    pTVar9->u64 = 0x4030000000000000;
    pTVar9 = L->top;
    L->top = pTVar9 + 1;
    pTVar9->u64 = 0x4030000000000000;
    lVar10 = 0;
    do {
      lVar5 = *(long *)((long)exptr + lVar10 * 8 + 0x80);
      pTVar9 = L->top;
      L->top = pTVar9 + 1;
      pTVar9->n = (double)lVar5;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x10);
    pTVar9 = L->top;
    lVar10 = 0;
    do {
      *pTVar9 = *(TValue *)((long)exptr + lVar10 * 8);
      pTVar9 = L->top;
      if (NAN(pTVar9->n)) {
        pTVar9->u64 = 0xfff8000000000000;
        pTVar9 = L->top;
      }
      pTVar9 = pTVar9 + 1;
      L->top = pTVar9;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x10);
    lj_vmevent_call(L,argbase);
  }
  uVar15 = (ulong)L->cframe & 0xfffffffffffffffc;
  *(BCIns **)(uVar15 + 0x18) = local_38;
  if (iVar7 != 0) {
    return -iVar7;
  }
  uVar4 = (L->glref).ptr64;
  bVar1 = *(byte *)(uVar4 + 0x91);
  if (-1 < (char)bVar1) {
    cVar2 = *(char *)(uVar4 + 0x21);
    if ((cVar2 == '\x05') || (cVar2 == '\x02')) {
      if (bVar1 < 0x40) {
        lj_gc_step(L);
      }
    }
    else if (((J[-1].penalty[0x2d].val & 0x6000) == 0) &&
            (*(char *)((J->L->base[-2].u64 & 0x7fffffffffff) + 10) == '\0')) {
      lVar10 = *(long *)(J->trace[J->parent].gcptr64 + 0x30);
      uVar13 = (uint)*(byte *)(lVar10 + 0xb + (ulong)J->exitno * 0xc);
      if ((uVar13 != 0xff) &&
         (iVar7 = uVar13 + 1, *(char *)(lVar10 + (ulong)J->exitno * 0xc + 0xb) = (char)iVar7,
         J->param[7] <= iVar7)) {
        J->state = LJ_TRACE_START;
        lj_trace_ins(J,local_38);
      }
    }
  }
  uVar13 = *local_38;
  if ((char)uVar13 == 'W') {
    uVar4 = J->trace[uVar13 >> 0x10].gcptr64;
    bVar1 = *(byte *)(uVar4 + 0x50);
    puVar12 = (uint *)(uVar4 + 0x50);
    if (bVar1 - 0x4d < 0xfffffffc) {
      if ((bVar1 != 0x46) || (J->state != LJ_TRACE_RECORD)) goto LAB_0014809b;
    }
    else if (J->state != LJ_TRACE_RECORD) {
      *(uint **)(uVar15 + 0x18) = puVar12;
      local_38 = puVar12;
      goto LAB_0014809b;
    }
    J->patchins = uVar13;
    J->patchpc = local_38;
    *local_38 = *puVar12;
    J->bcskip = '\x01';
  }
LAB_0014809b:
  *piVar8 = iVar11;
  uVar3 = *local_38;
  uVar13 = (uVar3 & 0xff) - 0x3f;
  uVar13 = uVar13 >> 1 | (uint)((uVar13 & 1) != 0) << 0x1f;
  if (uVar13 - 1 < 2) {
    iVar11 = ~((uVar3 >> 0x10 & 0xff) + (uVar3 >> 8 & 0xff)) +
             (int)((ulong)((long)L->top - (long)L->base) >> 3);
  }
  else {
    if (uVar13 == 0) {
      iVar11 = (int)((ulong)((long)L->top - (long)L->base) >> 3) - (uVar3 >> 8 & 0xff);
    }
    else {
      if (uVar13 != 5) {
        if ((uVar3 & 0xff) < 0x59) {
          return 0;
        }
        return (int)((ulong)((long)L->top - (long)L->base) >> 3) + 1;
      }
      iVar11 = (int)((ulong)((long)L->top - (long)L->base) >> 3) -
               ((uVar3 >> 0x10) + (uVar3 >> 8 & 0xff));
    }
    iVar11 = iVar11 + 1;
  }
  return iVar11;
}

Assistant:

int LJ_FASTCALL lj_trace_exit(jit_State *J, void *exptr)
{
  ERRNO_SAVE
  lua_State *L = J->L;
  ExitState *ex = (ExitState *)exptr;
  ExitDataCP exd;
  int errcode, exitcode = J->exitcode;
  TValue exiterr;
  const BCIns *pc;
  void *cf;
  GCtrace *T;

  setnilV(&exiterr);
  if (exitcode) {  /* Trace unwound with error code. */
    J->exitcode = 0;
    copyTV(L, &exiterr, L->top-1);
  }

#ifdef EXITSTATE_PCREG
  J->parent = trace_exit_find(J, (MCode *)(intptr_t)ex->gpr[EXITSTATE_PCREG]);
#endif
  T = traceref(J, J->parent); UNUSED(T);
#ifdef EXITSTATE_CHECKEXIT
  if (J->exitno == T->nsnap) {  /* Treat stack check like a parent exit. */
    lj_assertJ(T->root != 0, "stack check in root trace");
    J->exitno = T->ir[REF_BASE].op2;
    J->parent = T->ir[REF_BASE].op1;
    T = traceref(J, J->parent);
  }
#endif
  lj_assertJ(T != NULL && J->exitno < T->nsnap, "bad trace or exit number");
  exd.J = J;
  exd.exptr = exptr;
  errcode = lj_vm_cpcall(L, NULL, &exd, trace_exit_cp);
  if (errcode)
    return -errcode;  /* Return negated error code. */

  if (exitcode) copyTV(L, L->top++, &exiterr);  /* Anchor the error object. */

  if (!(LJ_HASPROFILE && (G(L)->hookmask & HOOK_PROFILE)))
    lj_vmevent_send(L, TEXIT,
      lj_state_checkstack(L, 4+RID_NUM_GPR+RID_NUM_FPR+LUA_MINSTACK);
      setintV(L->top++, J->parent);
      setintV(L->top++, J->exitno);
      trace_exit_regs(L, ex);
    );

  pc = exd.pc;
  cf = cframe_raw(L->cframe);
  setcframe_pc(cf, pc);
  if (exitcode) {
    return -exitcode;
  } else if (LJ_HASPROFILE && (G(L)->hookmask & HOOK_PROFILE)) {
    /* Just exit to interpreter. */
  } else if (G(L)->gc.state == GCSatomic || G(L)->gc.state == GCSfinalize) {
    if (!(G(L)->hookmask & HOOK_GC))
      lj_gc_step(L);  /* Exited because of GC: drive GC forward. */
  } else {
    trace_hotside(J, pc);
  }
  if (bc_op(*pc) == BC_JLOOP) {
    BCIns *retpc = &traceref(J, bc_d(*pc))->startins;
    int isret = bc_isret(bc_op(*retpc));
    if (isret || bc_op(*retpc) == BC_ITERN) {
      if (J->state == LJ_TRACE_RECORD) {
	J->patchins = *pc;
	J->patchpc = (BCIns *)pc;
	*J->patchpc = *retpc;
	J->bcskip = 1;
      } else if (isret) {
	pc = retpc;
	setcframe_pc(cf, pc);
      }
    }
  }
#ifdef LUA_USE_TRACE_LOGS
  lj_log_trace_normal_exit(L, (int) T->traceno, pc);
#endif
  /* Return MULTRES or 0. */
  ERRNO_RESTORE
  switch (bc_op(*pc)) {
  case BC_CALLM: case BC_CALLMT:
    return (int)((BCReg)(L->top - L->base) - bc_a(*pc) - bc_c(*pc) - LJ_FR2);
  case BC_RETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc) - bc_d(*pc));
  case BC_TSETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc));
  default:
    if (bc_op(*pc) >= BC_FUNCF)
      return (int)((BCReg)(L->top - L->base) + 1);
    return 0;
  }
}